

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vnode.c
# Opt level: O1

int delete_watch(filter *filt,knote *kn)

{
  int __fd;
  int iVar1;
  int iVar2;
  
  __fd = (kn->field_10).kn_vnode.inotifyfd;
  if (__fd < 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    iVar1 = epoll_ctl(filt->kf_kqueue->epollfd,2,__fd,(epoll_event *)0x0);
    if (iVar1 < 0) {
      iVar2 = -1;
    }
    else {
      close(__fd);
      (kn->field_10).kn_vnode.inotifyfd = -1;
    }
  }
  return iVar2;
}

Assistant:

static int
delete_watch(struct filter *filt, struct knote *kn)
{
    int ifd = kn->kn_vnode.inotifyfd;

    if (ifd < 0)
        return (0);
    if (epoll_ctl(filter_epoll_fd(filt), EPOLL_CTL_DEL, ifd, NULL) < 0) {
        dbg_perror("epoll_ctl(2)");
        return (-1);
    }
    (void) close(ifd);
    kn->kn_vnode.inotifyfd = -1;

    return (0);
}